

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DefineTextureFromImage::exec(DefineTextureFromImage *this,Thread *t)

{
  code *pcVar1;
  glEGLImageTargetTexture2DOESFunc p_Var2;
  deUint32 dVar3;
  deBool dVar4;
  MessageBuilder *pMVar5;
  Texture *pTVar6;
  EGLImage *pEVar7;
  GLES2Context *pGVar8;
  MessageBuilder local_990;
  MessageBuilder local_800;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  DefineTextureFromImage *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [39])"Begin -- glBindTexture(GL_TEXTURE_2D, ");
  pTVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pTVar6->texture);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8);
    pTVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    (*pcVar1)(0xde1,pTVar6->texture);
    dVar3 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,2000);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4e0,
                      (char (*) [54])"Begin -- glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, ");
  pEVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pEVar7->image);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
  pGVar8 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                     ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&local_20[1].m_random);
  p_Var2 = (pGVar8->glExtensions).imageTargetTexture2D;
  pEVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator->(&this->m_image);
  (*p_Var2)(0xde1,pEVar7->image);
  dVar3 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
  glu::checkError(dVar3,"glEGLImageTargetTexture2DOES()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                  ,0x7d5);
  tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_670,(char (*) [38])"End -- glEGLImageTargetTexture2DOES()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
  tcu::ThreadUtil::Thread::newMessage(&local_800,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_800,(char (*) [41])"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_800);
  do {
    (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar3 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x7d9);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_990,local_20);
  pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_990,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_990);
  return;
}

Assistant:

void DefineTextureFromImage::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, " << m_image->image << ")" << tcu::ThreadUtil::Message::End;
	thread.runtimeContext->glExtensions.imageTargetTexture2D(GL_TEXTURE_2D, m_image->image);
	GLU_CHECK_GLW_MSG(thread.gl, "glEGLImageTargetTexture2DOES()");
	thread.newMessage() << "End -- glEGLImageTargetTexture2DOES()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}